

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O3

void recvtftp(testcase *test,formats *pf)

{
  ssize_t sVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  char *msg;
  int iVar6;
  bool bVar7;
  unsigned_short recvblock;
  tftphdr *rdp;
  ushort local_e2;
  tftphdr_storage_t *local_e0;
  sigaction local_c8;
  
  local_e2 = 0;
  newline = 0;
  prevchar = -1;
  bfs[0].counter = -3;
  current = 0;
  bfs[1].counter = -2;
  nextone = 0;
  local_e0 = &bfs[0].buf;
  memset(&local_c8.sa_mask,0,0x90);
  local_c8.__sigaction_handler.sa_handler = timer;
  sigaction(0xe,&local_c8,(sigaction *)0x0);
LAB_00106ebe:
  timeout = 0;
  ackbuf.hdr.th_opcode = 0x400;
  ackbuf._2_2_ = local_e2 << 8 | local_e2 >> 8;
  local_e2 = local_e2 + 1;
  __sigsetjmp(timeoutbuf,1);
  do {
    sVar1 = send(peer,&ackbuf,4,0x4000);
    if (sVar1 != 4) {
      msg = "write: fail\n";
LAB_001071a0:
      logmsg(msg);
      return;
    }
    write_behind(test,pf->f_convert);
    do {
      do {
        alarm(5);
        uVar2 = recv(peer,local_e0,0x204,0);
        alarm(0);
        if (got_exit_signal != 0) {
          return;
        }
        if ((long)uVar2 < 0) {
          msg = "read: fail\n";
          goto LAB_001071a0;
        }
        (local_e0->hdr).th_opcode =
             (local_e0->hdr).th_opcode << 8 | (ushort)(local_e0->hdr).th_opcode >> 8;
        *(ushort *)((long)local_e0 + 2) =
             *(ushort *)((long)local_e0 + 2) << 8 | *(ushort *)((long)local_e0 + 2) >> 8;
        if ((local_e0->hdr).th_opcode == 5) {
          return;
        }
      } while ((local_e0->hdr).th_opcode != 3);
      if (*(ushort *)((long)local_e0 + 2) == local_e2) {
        iVar6 = (int)uVar2 + -4;
        iVar5 = pf->f_convert;
        bVar7 = (ulong)(uint)current == 0;
        bfs[(uint)current].counter = iVar6;
        current = (int)bVar7;
        if (*(int *)((long)&bfs[0].counter + (ulong)((uint)bVar7 * 0x200 + (uint)bVar7 * 8)) != -2)
        {
          write_behind(test,iVar5);
        }
        uVar3 = (ulong)(uint)current;
        local_e0 = &bfs[uVar3].buf;
        bfs[uVar3].counter = -3;
        if (0x20000000 < uVar2 >> 2) {
          if (iVar6 < 0) {
            piVar4 = __errno_location();
            iVar5 = *piVar4 + 100;
          }
          else {
            iVar5 = 3;
          }
          nak(iVar5);
          return;
        }
        if (iVar6 != 0x200) {
          write_behind(test,pf->f_convert);
          ackbuf.hdr.th_opcode = 0x400;
          ackbuf._2_2_ = local_e2 * 0x100 | local_e2 >> 8;
          send(peer,&ackbuf,4,0x4000);
          memset(&local_c8.sa_mask,0,0x90);
          local_c8.__sigaction_handler.sa_handler = justtimeout;
          sigaction(0xe,&local_c8,(sigaction *)0x0);
          alarm(5);
          sVar1 = recv(peer,&buf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sVar1 < 4) {
            return;
          }
          if ((local_e0->hdr).th_opcode != 3) {
            return;
          }
          if (local_e2 != *(ushort *)((long)&bfs[uVar3].buf + 2)) {
            return;
          }
          send(peer,&ackbuf,4,0x4000);
          return;
        }
        goto LAB_00106ebe;
      }
      synchnet(peer);
    } while (local_e2 - 1 != (uint)*(ushort *)((long)local_e0 + 2));
  } while( true );
}

Assistant:

static void recvtftp(struct testcase *test, struct formats *pf)
{
  ssize_t n, size;
  /* These are volatile to live through a siglongjmp */
  volatile unsigned short recvblock; /* block count */
  struct tftphdr * volatile rdp;     /* data buffer */
  struct tftphdr *rap;      /* ack buffer */

  recvblock = 0;
  rdp = w_init();
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  rap = &ackbuf.hdr;
  do {
    timeout = 0;
    rap->th_opcode = htons((unsigned short)opcode_ACK);
    rap->th_block = htons(recvblock);
    recvblock++;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
send_ack:
    if(swrite(peer, &ackbuf.storage[0], 4) != 4) {
      logmsg("write: fail\n");
      goto abort;
    }
    write_behind(test, pf->f_convert);
    for(;;) {
#ifdef HAVE_ALARM
      alarm(rexmtval);
#endif
      n = sread(peer, rdp, PKTSIZE);
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        goto abort;
      if(n < 0) {                       /* really? */
        logmsg("read: fail\n");
        goto abort;
      }
      rdp->th_opcode = ntohs((unsigned short)rdp->th_opcode);
      rdp->th_block = ntohs(rdp->th_block);
      if(rdp->th_opcode == opcode_ERROR)
        goto abort;
      if(rdp->th_opcode == opcode_DATA) {
        if(rdp->th_block == recvblock) {
          break;                         /* normal */
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if(rdp->th_block == (recvblock-1))
          goto send_ack;                 /* rexmit */
      }
    }

    size = writeit(test, &rdp, (int)(n - 4), pf->f_convert);
    if(size != (n-4)) {                 /* ahem */
      if(size < 0)
        nak(errno + 100);
      else
        nak(ENOSPACE);
      goto abort;
    }
  } while(size == SEGSIZE);
  write_behind(test, pf->f_convert);

  rap->th_opcode = htons((unsigned short)opcode_ACK);  /* send the "final"
                                                          ack */
  rap->th_block = htons(recvblock);
  (void) swrite(peer, &ackbuf.storage[0], 4);
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, justtimeout);        /* just abort read on timeout */
  alarm(rexmtval);
#endif
  /* normally times out and quits */
  n = sread(peer, &buf.storage[0], sizeof(buf.storage));
#ifdef HAVE_ALARM
  alarm(0);
#endif
  if(got_exit_signal)
    goto abort;
  if(n >= 4 &&                               /* if read some data */
     rdp->th_opcode == opcode_DATA &&        /* and got a data block */
     recvblock == rdp->th_block) {           /* then my last ack was lost */
    (void) swrite(peer, &ackbuf.storage[0], 4);  /* resend final ack */
  }
abort:
  return;
}